

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  
  iVar1 = Vec_IntEntry(&p->pNtk->vTypes,iObj);
  switch(iVar1) {
  case 0:
  case 99:
    pcVar6 = (char *)0x0;
    break;
  case 1:
    pcVar6 = "pi";
    break;
  case 2:
    pcVar6 = "po";
    break;
  case 3:
    pcVar6 = "ci";
    break;
  case 4:
    pcVar6 = "co";
    break;
  case 5:
    pcVar6 = "fon";
    break;
  case 6:
    pcVar6 = "box";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/abcOper.h"
                  ,0xe7,"const char *Abc_OperName(int)");
  case 0xb:
    pcVar6 = "buf";
    break;
  case 0xc:
    pcVar6 = "~";
    break;
  case 0xd:
  case 0x1e:
    pcVar6 = "&";
    break;
  case 0xe:
  case 0x1f:
    pcVar6 = "~&";
    break;
  case 0xf:
  case 0x20:
    pcVar6 = "|";
    break;
  case 0x10:
  case 0x21:
    pcVar6 = "~|";
    break;
  case 0x11:
  case 0x22:
    pcVar6 = "^";
    break;
  case 0x12:
  case 0x23:
    pcVar6 = "~^";
    break;
  case 0x15:
    pcVar6 = "mux";
    break;
  case 0x16:
    pcVar6 = "maj";
    break;
  case 0x24:
    pcVar6 = "!";
    break;
  case 0x25:
    pcVar6 = "&&";
    break;
  case 0x27:
    pcVar6 = "||";
    break;
  case 0x29:
    pcVar6 = "^^";
    break;
  case 0x32:
    pcVar6 = "+";
    break;
  case 0x33:
  case 0x3a:
    pcVar6 = "-";
    break;
  case 0x34:
  case 0x35:
    pcVar6 = "*";
    break;
  case 0x36:
    pcVar6 = "/";
    break;
  case 0x37:
    pcVar6 = "mod";
    break;
  case 0x38:
    pcVar6 = "%";
    break;
  case 0x39:
    pcVar6 = "**";
    break;
  case 0x3b:
    pcVar6 = "sqrt";
    break;
  case 0x3e:
    pcVar6 = "<";
    break;
  case 0x3f:
    pcVar6 = "<=";
    break;
  case 0x40:
    pcVar6 = ">=";
    break;
  case 0x41:
    pcVar6 = ">";
    break;
  case 0x42:
    pcVar6 = "==";
    break;
  case 0x43:
    pcVar6 = "!=";
    break;
  case 0x44:
    pcVar6 = "<<";
    break;
  case 0x45:
    pcVar6 = ">>";
    break;
  case 0x46:
    pcVar6 = "<<<";
    break;
  case 0x47:
    pcVar6 = ">>>";
    break;
  case 0x48:
    pcVar6 = "rotL";
    break;
  case 0x49:
    pcVar6 = "rotR";
    break;
  case 0x4b:
    pcVar6 = "lut";
    break;
  case 0x4d:
    pcVar6 = "table";
    break;
  case 0x59:
    pcVar6 = "DFFRSE";
    break;
  case 0x5b:
    pcVar6 = "[:]";
    break;
  case 0x5c:
    pcVar6 = "{}";
    break;
  case 0x5d:
    pcVar6 = "zPad";
    break;
  case 0x5e:
    pcVar6 = "sExt";
    break;
  case 0x5f:
    pcVar6 = "=>";
    break;
  case 0x60:
    pcVar6 = "squar";
    break;
  case 0x61:
    pcVar6 = "const";
  }
  uVar2 = Vec_IntEntry(&p->pNtk->vNameIds,iObj);
  uVar3 = Vec_IntEntry(&p->pNtk->vInstIds,iObj);
  printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",(ulong)(uint)iObj,pcVar6
         ,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)p->pNtk->vFanins[iObj].nSize);
  for (lVar7 = 0; lVar7 < p->pNtk->vFanins[iObj].nSize; lVar7 = lVar7 + 1) {
    piVar5 = Wln_RetFanins(p,iObj);
    uVar2 = piVar5[lVar7 * 2];
    piVar5 = Wln_RetFanins(p,iObj);
    if (((long)(int)uVar2 != 0) &&
       ((p->pNtk->vFanins[(int)uVar2].nSize != 0 || (iVar1 = Wln_ObjIsCi(p->pNtk,uVar2), iVar1 != 0)
        ))) {
      printf("%5d ",(ulong)uVar2);
      uVar2 = piVar5[lVar7 * 2 + 1];
      if (uVar2 != 0) {
        uVar3 = Vec_IntEntry(&p->vEdgeLinks,uVar2);
        uVar4 = Vec_IntEntry(&p->vEdgeLinks,piVar5[lVar7 * 2 + 1] + 1);
        printf("(%d : %d %d) ",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}